

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

void luaL_where(lua_State *L,int level)

{
  int iVar1;
  lua_Debug ar;
  lua_Debug lStack_88;
  
  iVar1 = lua_getstack(L,level,&lStack_88);
  if ((iVar1 != 0) && (lua_getinfo(L,"Sl",&lStack_88), 0 < lStack_88.currentline)) {
    lua_pushfstring(L,"%s:%d: ",lStack_88.short_src);
    return;
  }
  lua_pushlstring(L,"",0);
  return;
}

Assistant:

LUALIB_API void luaL_where (lua_State *L, int level) {
  lua_Debug ar;
  if (lua_getstack(L, level, &ar)) {  /* check function at level */
    lua_getinfo(L, "Sl", &ar);  /* get info about it */
    if (ar.currentline > 0) {  /* is there info? */
      lua_pushfstring(L, "%s:%d: ", ar.short_src, ar.currentline);
      return;
    }
  }
  lua_pushliteral(L, "");  /* else, no information available... */
}